

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcc_uint.c
# Opt level: O3

qcc_generator_ptr qcc_gen_uint_not_equal_to(qcc_context *ctx,size_t size,qcc_uint value)

{
  qcc_uint qVar1;
  qcc_generator_ptr pqVar2;
  qcc_generator_ptr pqVar3;
  qcc_uint min;
  
  if (value == 0) {
    min = 1;
    qVar1 = 0xffffffffffffffff;
  }
  else {
    qVar1 = qcc_uint_max(size);
    if (qVar1 != value) {
      pqVar2 = qcc_gen_uint_in_range(ctx,size,0,value - 1);
      pqVar3 = qcc_gen_uint_in_range(ctx,size,value + 1,0xffffffffffffffff);
      pqVar2 = qcc_gen_one_of(ctx,pqVar2,pqVar3,0);
      return pqVar2;
    }
    qVar1 = qcc_uint_max(size);
    qVar1 = qVar1 - 1;
    min = 0;
  }
  pqVar2 = qcc_gen_uint_in_range(ctx,size,min,qVar1);
  return pqVar2;
}

Assistant:

qcc_generator_ptr qcc_gen_uint_not_equal_to(struct qcc_context *ctx,
                                            size_t size, qcc_uint value)
{
    if (value == 0) return qcc_gen_uint_greater_than(ctx, size, 0);
    if (value == qcc_uint_max(size))
        return qcc_gen_uint_less_than(ctx, size, qcc_uint_max(size));
    return qcc_gen_one_of(ctx, qcc_gen_uint_less_than(ctx, size, value),
                          qcc_gen_uint_greater_than(ctx, size, value),
                          (void *)0);
}